

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void duckdb::PerformKeyComparison
               (InsertState *state,JoinHashTable *ht,TupleDataCollection *data_collection,
               Vector *row_locations,idx_t count,idx_t *key_match_count,idx_t *key_no_match_count)

{
  DataChunk *this;
  TupleDataChunkState *chunk_state;
  sel_t *psVar1;
  SelectionVector *target_sel;
  type rhs_layout;
  idx_t iVar2;
  
  this = &state->lhs_data;
  DataChunk::Reset(this);
  (state->lhs_data).count = count;
  chunk_state = &state->chunk_state;
  TupleDataCollection::ResetCachedCastVectors(chunk_state,&ht->equality_predicate_columns);
  target_sel = FlatVector::IncrementalSelectionVector();
  TupleDataCollection::Gather
            (data_collection,row_locations,&(state->super_SharedState).salt_match_sel,count,
             &ht->equality_predicate_columns,this,target_sel,
             &(state->chunk_state).cached_cast_vectors);
  TupleDataCollection::ToUnifiedFormat(chunk_state,this);
  psVar1 = (state->key_match_sel).sel_vector;
  for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
    psVar1[iVar2] = (sel_t)iVar2;
  }
  rhs_layout = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(&ht->layout_ptr);
  iVar2 = RowMatcher::Match(&ht->row_matcher_build,this,&chunk_state->vector_data,
                            &state->key_match_sel,count,rhs_layout,(Vector *)state,
                            &(state->super_SharedState).key_no_match_sel,key_no_match_count);
  *key_match_count = iVar2;
  return;
}

Assistant:

static inline void PerformKeyComparison(JoinHashTable::InsertState &state, JoinHashTable &ht,
                                        const TupleDataCollection &data_collection, Vector &row_locations,
                                        const idx_t count, idx_t &key_match_count, idx_t &key_no_match_count) {
	// Get the data for the rows that need to be compared
	state.lhs_data.Reset();
	state.lhs_data.SetCardinality(count); // the right size

	// The target selection vector says where to write the results into the lhs_data, we just want to write
	// sequentially as otherwise we trigger a bug in the Gather function
	data_collection.ResetCachedCastVectors(state.chunk_state, ht.equality_predicate_columns);
	data_collection.Gather(row_locations, state.salt_match_sel, count, ht.equality_predicate_columns, state.lhs_data,
	                       *FlatVector::IncrementalSelectionVector(), state.chunk_state.cached_cast_vectors);
	TupleDataCollection::ToUnifiedFormat(state.chunk_state, state.lhs_data);

	for (idx_t i = 0; i < count; i++) {
		state.key_match_sel.set_index(i, i);
	}

	// Perform row comparisons
	key_match_count = ht.row_matcher_build.Match(state.lhs_data, state.chunk_state.vector_data, state.key_match_sel,
	                                             count, *ht.layout_ptr, state.rhs_row_locations,
	                                             &state.key_no_match_sel, key_no_match_count);

	D_ASSERT(key_match_count + key_no_match_count == count);
}